

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

_Bool al_fclose(ALLEGRO_FILE *f)

{
  _Bool _Var1;
  
  if (f == (ALLEGRO_FILE *)0x0) {
    al_set_errno(0x16);
    _Var1 = false;
  }
  else {
    _Var1 = (*f->vtable->fi_fclose)(f);
    al_free_with_context
              (f,0x5a,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/file.c"
               ,"al_fclose");
  }
  return _Var1;
}

Assistant:

bool al_fclose(ALLEGRO_FILE *f)
{
   if (f) {
      bool ret = f->vtable->fi_fclose(f);
      al_free(f);
      return ret;
   }

   al_set_errno(EINVAL);
   return false;
}